

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

char * al_get_path_extension(ALLEGRO_PATH *path)

{
  size_t sVar1;
  char *pcVar2;
  long in_RDI;
  int pos;
  ALLEGRO_USTR *in_stack_00000018;
  int local_c;
  
  al_ustr_size(*(ALLEGRO_USTR **)(in_RDI + 8));
  local_c = al_ustr_rfind_chr(in_stack_00000018,path._4_4_,(int32_t)path);
  if (local_c == -1) {
    sVar1 = al_ustr_size(*(ALLEGRO_USTR **)(in_RDI + 8));
    local_c = (int)sVar1;
  }
  pcVar2 = al_cstr(*(ALLEGRO_USTR **)(in_RDI + 8));
  return pcVar2 + local_c;
}

Assistant:

const char *al_get_path_extension(const ALLEGRO_PATH *path)
{
   int pos;
   ASSERT(path);

   pos = al_ustr_rfind_chr(path->filename, al_ustr_size(path->filename), '.');
   if (pos == -1)
      pos = al_ustr_size(path->filename);

   return al_cstr(path->filename) + pos;  /* include dot */
}